

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_click(ImGuiInputTextState *str,STB_TexteditState *state,float x,float y)

{
  int iVar1;
  undefined1 local_38 [8];
  StbTexteditRow r;
  float y_local;
  float x_local;
  STB_TexteditState *state_local;
  ImGuiInputTextState *str_local;
  
  r.ymax = y;
  r.num_chars = (int)x;
  if (state->single_line != '\0') {
    STB_TEXTEDIT_LAYOUTROW((StbTexteditRow *)local_38,str,0);
    r.ymax = r.x1;
  }
  iVar1 = stb_text_locate_coord(str,(float)r.num_chars,r.ymax);
  state->cursor = iVar1;
  state->select_start = state->cursor;
  state->select_end = state->cursor;
  state->has_preferred_x = '\0';
  return;
}

Assistant:

static void stb_textedit_click(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, float x, float y)
{
   // In single-line mode, just always make y = 0. This lets the drag keep working if the mouse
   // goes off the top or bottom of the text
   if( state->single_line )
   {
      StbTexteditRow r;
      STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
      y = r.ymin;
   }

   state->cursor = stb_text_locate_coord(str, x, y);
   state->select_start = state->cursor;
   state->select_end = state->cursor;
   state->has_preferred_x = 0;
}